

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse_error(json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this,size_t param_1,string *param_2,exception *ex)

{
  int iVar1;
  parse_error *this_00;
  pointer_____offset_0x10___ *ppuVar2;
  
  this->errored = true;
  if (this->allow_exceptions == true) {
    iVar1 = ex->id / 100;
    switch(iVar1 + ~((iVar1 / 100) * 100)) {
    case 0:
      this_00 = (parse_error *)__cxa_allocate_exception(0x28);
      detail::parse_error::parse_error(this_00,(parse_error *)ex);
      ppuVar2 = &detail::parse_error::typeinfo;
      break;
    case 1:
      this_00 = (parse_error *)__cxa_allocate_exception(0x20);
      invalid_iterator::invalid_iterator((invalid_iterator *)this_00,(invalid_iterator *)ex);
      ppuVar2 = &invalid_iterator::typeinfo;
      break;
    case 2:
      this_00 = (parse_error *)__cxa_allocate_exception(0x20);
      type_error::type_error((type_error *)this_00,(type_error *)ex);
      ppuVar2 = &type_error::typeinfo;
      break;
    case 3:
      this_00 = (parse_error *)__cxa_allocate_exception(0x20);
      out_of_range::out_of_range((out_of_range *)this_00,(out_of_range *)ex);
      ppuVar2 = &out_of_range::typeinfo;
      break;
    case 4:
      this_00 = (parse_error *)__cxa_allocate_exception(0x20);
      other_error::other_error((other_error *)this_00,(other_error *)ex);
      ppuVar2 = &other_error::typeinfo;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0xeeb,
                    "bool nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<>>::parse_error(std::size_t, const std::string &, const detail::exception &) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    __cxa_throw(this_00,ppuVar2,exception::~exception);
  }
  return false;
}

Assistant:

bool parse_error(std::size_t /*unused*/, const std::string& /*unused*/, const detail::exception& ex) {
		errored = true;
		if (allow_exceptions) {
			// determine the proper exception type from the id
			switch ((ex.id / 100) % 100) {
				case 1:
					JSON_THROW(*reinterpret_cast<const detail::parse_error*>(&ex));
				case 4:
					JSON_THROW(*reinterpret_cast<const detail::out_of_range*>(&ex));
				// LCOV_EXCL_START
				case 2:
					JSON_THROW(*reinterpret_cast<const detail::invalid_iterator*>(&ex));
				case 3:
					JSON_THROW(*reinterpret_cast<const detail::type_error*>(&ex));
				case 5:
					JSON_THROW(*reinterpret_cast<const detail::other_error*>(&ex));
				default:
					assert(false);
					// LCOV_EXCL_STOP
			}
		}
		return false;
	}